

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

char * uloc_kw_nextKeyword(UEnumeration *en,int32_t *resultLength,UErrorCode *param_3)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  
  pvVar1 = en->context;
  __s = *(char **)((long)pvVar1 + 8);
  if (*__s == '\0') {
    __s = (char *)0x0;
    iVar2 = 0;
  }
  else {
    sVar3 = strlen(__s);
    iVar2 = (int)sVar3;
    *(char **)((long)pvVar1 + 8) = __s + (iVar2 + 1);
  }
  if (resultLength != (int32_t *)0x0) {
    *resultLength = iVar2;
  }
  return __s;
}

Assistant:

static const char * U_CALLCONV
uloc_kw_nextKeyword(UEnumeration* en,
                    int32_t* resultLength,
                    UErrorCode* /*status*/) {
    const char* result = ((UKeywordsContext *)en->context)->current;
    int32_t len = 0;
    if(*result) {
        len = (int32_t)uprv_strlen(((UKeywordsContext *)en->context)->current);
        ((UKeywordsContext *)en->context)->current += len+1;
    } else {
        result = NULL;
    }
    if (resultLength) {
        *resultLength = len;
    }
    return result;
}